

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psnr.c
# Opt level: O1

int64_t highbd_get_sse(uint8_t *a,int a_stride,uint8_t *b,int b_stride,int width,int height)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int64_t iVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  uint8_t *puVar11;
  int64_t iVar12;
  uint8_t *puVar13;
  int j;
  ulong uVar14;
  
  iVar1 = width + 0xf;
  if (-1 < width) {
    iVar1 = width;
  }
  uVar5 = width % 0x10;
  iVar2 = height + 0xf;
  if (-1 < height) {
    iVar2 = height;
  }
  iVar3 = height % 0x10;
  iVar7 = 0;
  if ((int)uVar5 < 1 || height < 1) {
    iVar12 = 0;
  }
  else {
    lVar8 = (long)(b + (int)(width - uVar5)) * 2;
    lVar6 = (long)(a + (int)(width - uVar5)) * 2;
    iVar12 = 0;
    do {
      uVar14 = 0;
      do {
        iVar10 = (uint)*(ushort *)(lVar6 + uVar14 * 2) - (uint)*(ushort *)(lVar8 + uVar14 * 2);
        iVar12 = iVar12 + (ulong)(uint)(iVar10 * iVar10);
        uVar14 = uVar14 + 1;
      } while (uVar5 != uVar14);
      iVar7 = iVar7 + 1;
      lVar8 = lVar8 + (long)b_stride * 2;
      lVar6 = lVar6 + (long)a_stride * 2;
    } while (iVar7 != height);
  }
  if (0 < iVar3) {
    lVar8 = (long)(b + (height - iVar3) * b_stride) * 2;
    lVar6 = (long)(a + (height - iVar3) * a_stride) * 2;
    iVar7 = 0;
    lVar9 = 0;
    do {
      if (0 < (int)(width - uVar5)) {
        uVar14 = 0;
        do {
          iVar10 = (uint)*(ushort *)(lVar6 + uVar14 * 2) - (uint)*(ushort *)(lVar8 + uVar14 * 2);
          lVar9 = lVar9 + (ulong)(uint)(iVar10 * iVar10);
          uVar14 = uVar14 + 1;
        } while (width - uVar5 != uVar14);
      }
      iVar7 = iVar7 + 1;
      lVar8 = lVar8 + (long)b_stride * 2;
      lVar6 = lVar6 + (long)a_stride * 2;
    } while (iVar7 != iVar3);
    iVar12 = iVar12 + lVar9;
  }
  if (0xf < height) {
    iVar3 = 0;
    do {
      puVar11 = a;
      puVar13 = b;
      iVar7 = iVar1 >> 4;
      if (0xf < width) {
        do {
          iVar4 = (*aom_highbd_sse)(puVar11,a_stride,puVar13,b_stride,0x10,0x10);
          iVar12 = iVar12 + iVar4;
          iVar7 = iVar7 + -1;
          puVar11 = puVar11 + 0x10;
          puVar13 = puVar13 + 0x10;
        } while (iVar7 != 0);
      }
      a = a + (a_stride << 4);
      b = b + (b_stride << 4);
      iVar3 = iVar3 + 1;
    } while (iVar3 != iVar2 >> 4);
  }
  return iVar12;
}

Assistant:

static int64_t highbd_get_sse(const uint8_t *a, int a_stride, const uint8_t *b,
                              int b_stride, int width, int height) {
  int64_t total_sse = 0;
  int x, y;
  const int dw = width % 16;
  const int dh = height % 16;

  if (dw > 0) {
    total_sse += encoder_highbd_sse(&a[width - dw], a_stride, &b[width - dw],
                                    b_stride, dw, height);
  }
  if (dh > 0) {
    total_sse += encoder_highbd_sse(&a[(height - dh) * a_stride], a_stride,
                                    &b[(height - dh) * b_stride], b_stride,
                                    width - dw, dh);
  }

  for (y = 0; y < height / 16; ++y) {
    const uint8_t *pa = a;
    const uint8_t *pb = b;
    for (x = 0; x < width / 16; ++x) {
      total_sse += aom_highbd_sse(pa, a_stride, pb, b_stride, 16, 16);
      pa += 16;
      pb += 16;
    }
    a += 16 * a_stride;
    b += 16 * b_stride;
  }
  return total_sse;
}